

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeTriang>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapeTriang> *this)

{
  long local_20;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_017889a0;
  TPZIntelGen<pzshape::TPZShapeTriang>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeTriang>,&PTR_PTR_01785a28);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_01785658;
  local_20 = -1;
  TPZManVector<long,_7>::TPZManVector(&this->fConnectIndexes,7,&local_20);
  this->fh1fam = EH1Standard;
  return;
}

Assistant:

TPZCompElH1() = default;